

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_vprintf(mg_connection *conn,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  char *__s;
  int len;
  size_t sVar2;
  size_t size;
  char mem [8192];
  undefined8 local_2058;
  void *pvStack_2050;
  void *local_2048;
  undefined8 local_2038;
  void *pvStack_2030;
  void *local_2028;
  
  local_2048 = ap->reg_save_area;
  local_2058._0_4_ = ap->gp_offset;
  local_2058._4_4_ = ap->fp_offset;
  pvStack_2050 = ap->overflow_arg_area;
  uVar1 = vsnprintf((char *)0x0,0,fmt,&local_2058);
  if ((int)uVar1 < 0) {
    local_2048 = ap->reg_save_area;
    local_2058._0_4_ = ap->gp_offset;
    local_2058._4_4_ = ap->fp_offset;
    pvStack_2050 = ap->overflow_arg_area;
    sVar2 = 0x800;
    uVar1 = 0xffffffff;
    __s = (char *)0x0;
    do {
      if (__s != (char *)0x0) {
        free(__s);
      }
      sVar2 = sVar2 * 4;
      __s = (char *)malloc(sVar2);
      if (__s == (char *)0x0) break;
      local_2028 = local_2048;
      local_2038 = local_2058;
      pvStack_2030 = pvStack_2050;
      uVar1 = vsnprintf(__s,sVar2 - 1,fmt,&local_2038);
      __s[sVar2 - 1] = '\0';
    } while ((int)uVar1 < 0);
  }
  else {
    if (uVar1 < 0x2000) {
      local_2048 = ap->reg_save_area;
      local_2058._0_4_ = ap->gp_offset;
      local_2058._4_4_ = ap->fp_offset;
      pvStack_2050 = ap->overflow_arg_area;
      __s = (char *)&local_2038;
      sVar2 = 0x2000;
    }
    else {
      sVar2 = (size_t)(uVar1 + 1);
      __s = (char *)malloc(sVar2);
      if (__s == (char *)0x0) {
        uVar1 = 0xffffffff;
        goto LAB_0011453c;
      }
      local_2048 = ap->reg_save_area;
      local_2058._0_4_ = ap->gp_offset;
      local_2058._4_4_ = ap->fp_offset;
      pvStack_2050 = ap->overflow_arg_area;
    }
    vsnprintf(__s,sVar2,fmt,&local_2058);
  }
LAB_0011453c:
  if (0 < (int)uVar1) {
    uVar1 = mg_write(conn,__s,(ulong)uVar1);
  }
  if (__s != (char *)&local_2038) {
    free(__s);
  }
  return uVar1;
}

Assistant:

static int
mg_vprintf(struct mg_connection *conn, const char *fmt, va_list ap)
{
	char mem[MG_BUF_LEN];
	char *buf = NULL;
	int len;

	if ((len = alloc_vprintf(&buf, mem, sizeof(mem), fmt, ap)) > 0) {
		len = mg_write(conn, buf, (size_t)len);
	}
	if (buf != mem) {
		mg_free(buf);
	}

	return len;
}